

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestrictionsConfig.h
# Opt level: O2

RestrictionsConfig *
jaegertracing::baggage::RestrictionsConfig::parse
          (RestrictionsConfig *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  int iVar2;
  char (*in_R8) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hostPort;
  duration local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = YAML::Node::IsDefined(configYAML);
  if (bVar1) {
    bVar1 = YAML::Node::IsMap(configYAML);
    if (bVar1) {
      local_38._M_dataplus._M_p._0_1_ = 0;
      bVar1 = utils::yaml::findOrDefault<bool,char[35],bool>
                        (configYAML,(char (*) [35])"denyBaggageOnInitializationFailure",
                         (bool *)&local_38);
      utils::yaml::findOrDefault<std::__cxx11::string,char[9],char[1]>
                (&local_38,(yaml *)configYAML,(Node *)"hostPort",(char (*) [9])0x113062,in_R8);
      local_40.__r = (ulong)local_40.__r._4_4_ << 0x20;
      iVar2 = utils::yaml::findOrDefault<int,char[16],int>
                        (configYAML,(char (*) [16])"refreshInterval",(int *)&local_40);
      local_40.__r = (long)iVar2 * 1000000000;
      RestrictionsConfig(__return_storage_ptr__,bVar1,&local_38,&local_40);
      goto LAB_0010ebad;
    }
  }
  std::__cxx11::string::string((string *)&local_38,"",(allocator *)&local_40);
  __return_storage_ptr__->_denyBaggageOnInitializationFailure = false;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->_hostPort,(string *)&local_38);
  (__return_storage_ptr__->_refreshInterval).__r = 0;
LAB_0010ebad:
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static RestrictionsConfig parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return RestrictionsConfig();
        }

        const auto denyBaggageOnInitializationFailure =
            utils::yaml::findOrDefault<bool>(
                configYAML, "denyBaggageOnInitializationFailure", false);
        const auto hostPort =
            utils::yaml::findOrDefault<std::string>(configYAML, "hostPort", "");
        const auto refreshInterval = std::chrono::seconds(
            utils::yaml::findOrDefault<int>(configYAML, "refreshInterval", 0));
        return RestrictionsConfig(
            denyBaggageOnInitializationFailure, hostPort, refreshInterval);
    }